

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O1

int Fl::has_check(Fl_Timeout_Handler cb,void *argp)

{
  Check *pCVar1;
  bool bVar2;
  Check **ppCVar3;
  Check *t;
  
  ppCVar3 = &first_check;
  do {
    pCVar1 = *ppCVar3;
    if (pCVar1 == (Check *)0x0) break;
    if ((pCVar1->cb == cb) && (pCVar1->arg == argp)) {
      bVar2 = false;
    }
    else {
      ppCVar3 = &pCVar1->next;
      bVar2 = true;
    }
  } while (bVar2);
  return (int)(pCVar1 != (Check *)0x0);
}

Assistant:

int Fl::has_check(Fl_Timeout_Handler cb, void *argp) {
  for (Check** p = &first_check; *p;) {
    Check* t = *p;
    if (t->cb == cb && t->arg == argp) {
      return 1;
    } else {
      p = &(t->next);
    }
  }
  return 0;
}